

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

string * __thiscall
QPDFJob::doUnderOverlayForPage_abi_cxx11_
          (string *__return_storage_ptr__,QPDFJob *this,QPDF *pdf,UnderOverlay *uo,
          map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
          *pagenos,size_t page_idx,size_t uo_idx,
          map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
          *fo,vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *pages,
          QPDFPageObjectHelper *dest_page)

{
  pointer piVar1;
  Rectangle rect;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  QPDFAcroFormDocumentHelper *afdh_00;
  mapped_type *pmVar7;
  unsigned_long __n;
  reference pvVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  QPDFAcroFormDocumentHelper *from_afdh;
  mapped_type *value;
  pointer piVar12;
  int from_pageno;
  allocator<char> local_239;
  int min_suffix;
  int pageno;
  QPDFObjectHandle resources;
  QPDFObjectHandle xobject;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  anon_class_8_1_89895067 make_afdh;
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  QPDFObjectHandle local_1a8;
  string new_content;
  undefined1 local_178 [16];
  value_type from_page;
  string name;
  undefined1 local_110 [32];
  QPDFMatrix cm;
  size_t page_idx_local;
  Rectangle local_b8;
  map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  afdh;
  QPDFPageObjectHelper local_68;
  
  page_idx_local = page_idx;
  iVar3 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&page_idx_local);
  pageno = iVar3 + 1;
  sVar4 = std::
          map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
          ::count(pagenos,&pageno);
  if (sVar4 != 0) {
    pmVar5 = std::
             map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
             ::operator[](pagenos,&pageno);
    sVar6 = std::
            map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::count(pmVar5,&uo_idx);
    if (sVar6 != 0) {
      afdh._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &afdh._M_t._M_impl.super__Rb_tree_header._M_header;
      afdh._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      afdh._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      afdh._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      make_afdh.afdh = &afdh;
      afdh._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           afdh._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      afdh_00 = doUnderOverlayForPage::anon_class_8_1_89895067::operator()(&make_afdh,dest_page);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      min_suffix = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&from_page,"/Resources",(allocator<char> *)&cm);
      QPDFPageObjectHelper::getAttribute
                ((QPDFPageObjectHelper *)&resources,(string *)dest_page,SUB81(&from_page,0));
      std::__cxx11::string::~string((string *)&from_page);
      pmVar5 = std::
               map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
               ::operator[](pagenos,&pageno);
      pmVar7 = std::
               map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](pmVar5,&uo_idx);
      piVar1 = (pmVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar12 = (pmVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start; piVar12 != piVar1; piVar12 = piVar12 + 1) {
        from_pageno = *piVar12;
        local_1c8._8_8_ = &from_pageno;
        local_1b0 = std::
                    _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:1928:21)>
                    ::_M_invoke;
        local_1b8 = std::
                    _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:1928:21)>
                    ::_M_manager;
        local_1c8._M_unused._M_object = uo;
        doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_1c8);
        std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
        cm.a._0_4_ = from_pageno + -1;
        __n = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert((int *)&cm);
        pvVar8 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                           (pages,__n);
        QPDFPageObjectHelper::QPDFPageObjectHelper(&from_page,pvVar8);
        pmVar9 = std::
                 map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                 ::operator[](fo,&from_pageno);
        sVar10 = std::
                 map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>
                 ::count(pmVar9,&uo_idx);
        if (sVar10 == 0) {
          QPDFPageObjectHelper::getFormXObjectForPage
                    ((QPDFPageObjectHelper *)local_178,SUB81(&from_page,0));
          QPDF::copyForeignObject((QPDF *)&cm,(QPDFObjectHandle *)pdf);
          pmVar9 = std::
                   map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                   ::operator[](fo,&from_pageno);
          p_Var11 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                    std::
                    map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>
                    ::operator[](pmVar9,&uo_idx);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (p_Var11,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&cm);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cm.b);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8));
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cm,"/Fx",(allocator<char> *)&new_content);
        QPDFObjectHandle::getUniqueResourceName
                  (&name,&resources,(string *)&cm,&min_suffix,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0);
        std::__cxx11::string::~string((string *)&cm);
        QPDFMatrix::QPDFMatrix(&cm);
        pmVar9 = std::
                 map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                 ::operator[](fo,&from_pageno);
        p_Var11 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                  std::
                  map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>
                  ::operator[](pmVar9,&uo_idx);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_1e0,p_Var11);
        QPDFPageObjectHelper::getTrimBox((QPDFPageObjectHelper *)local_110,SUB81(dest_page,0),false)
        ;
        QPDFObjectHandle::getArrayAsRectangle(&local_b8,(QPDFObjectHandle *)local_110);
        rect.lly = local_b8.lly;
        rect.llx = local_b8.llx;
        rect.urx = local_b8.urx;
        rect.ury = local_b8.ury;
        QPDFPageObjectHelper::placeFormXObject
                  (&new_content,dest_page,(QPDFObjectHandle *)&local_1e0,&name,rect,&cm,true,true,
                   false);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_110 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
        QPDFPageObjectHelper::QPDFPageObjectHelper(&local_68,&from_page);
        from_afdh = doUnderOverlayForPage::anon_class_8_1_89895067::operator()
                              (&make_afdh,&from_page);
        QPDFPageObjectHelper::copyAnnotations(dest_page,&local_68,&cm,afdh_00,from_afdh);
        QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_68);
        if (new_content._M_string_length != 0) {
          operator____qpdf((char *)&local_1a8,0x21615b);
          QPDFObjectHandle::mergeResources
                    (&resources,&local_1a8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)0x0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_1a8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_110,"/XObject",&local_239);
          QPDFObjectHandle::getKey(&xobject,(string *)&resources);
          std::__cxx11::string::~string((string *)local_110);
          bVar2 = QPDFObjectHandle::isDictionary(&xobject);
          if (bVar2) {
            pmVar9 = std::
                     map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                     ::operator[](fo,&from_pageno);
            value = std::
                    map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>
                    ::operator[](pmVar9,&uo_idx);
            QPDFObjectHandle::replaceKey(&xobject,&name,value);
          }
          min_suffix = min_suffix + 1;
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&xobject.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        std::__cxx11::string::~string((string *)&new_content);
        std::__cxx11::string::~string((string *)&name);
        QPDFPageObjectHelper::~QPDFPageObjectHelper(&from_page);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&resources.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::
      _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
      ::~_Rb_tree(&afdh._M_t);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&from_page);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFJob::doUnderOverlayForPage(
    QPDF& pdf,
    UnderOverlay& uo,
    std::map<int, std::map<size_t, std::vector<int>>>& pagenos,
    size_t page_idx,
    size_t uo_idx,
    std::map<int, std::map<size_t, QPDFObjectHandle>>& fo,
    std::vector<QPDFPageObjectHelper>& pages,
    QPDFPageObjectHelper& dest_page)
{
    int pageno = 1 + QIntC::to_int(page_idx);
    if (!(pagenos.count(pageno) && pagenos[pageno].count(uo_idx))) {
        return "";
    }

    std::map<unsigned long long, std::shared_ptr<QPDFAcroFormDocumentHelper>> afdh;
    auto make_afdh = [&](QPDFPageObjectHelper& ph) {
        QPDF& q = ph.getObjectHandle().getQPDF();
        return get_afdh_for_qpdf(afdh, &q);
    };
    auto dest_afdh = make_afdh(dest_page);

    std::string content;
    int min_suffix = 1;
    QPDFObjectHandle resources = dest_page.getAttribute("/Resources", true);
    for (int from_pageno: pagenos[pageno][uo_idx]) {
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << "    " << uo.filename << " " << uo.which << " " << from_pageno << "\n";
        });
        auto from_page = pages.at(QIntC::to_size(from_pageno - 1));
        if (fo[from_pageno].count(uo_idx) == 0) {
            fo[from_pageno][uo_idx] = pdf.copyForeignObject(from_page.getFormXObjectForPage());
        }

        // If the same page is overlaid or underlaid multiple times, we'll generate multiple names
        // for it, but that's harmless and also a pretty goofy case that's not worth coding around.
        std::string name = resources.getUniqueResourceName("/Fx", min_suffix);
        QPDFMatrix cm;
        std::string new_content = dest_page.placeFormXObject(
            fo[from_pageno][uo_idx], name, dest_page.getTrimBox().getArrayAsRectangle(), cm);
        dest_page.copyAnnotations(from_page, cm, dest_afdh, make_afdh(from_page));
        if (!new_content.empty()) {
            resources.mergeResources("<< /XObject << >> >>"_qpdf);
            auto xobject = resources.getKey("/XObject");
            if (xobject.isDictionary()) {
                xobject.replaceKey(name, fo[from_pageno][uo_idx]);
            }
            ++min_suffix;
            content += new_content;
        }
    }
    return content;
}